

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O1

void test_same_only(void)

{
  void *pvVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  pvVar1 = (*hm_new)();
  (*hm_insert)(pvVar1,0x7b,(void *)0x1c8,0);
  (*hm_insert)(pvVar1,0x7b,(void *)0x1c9,0);
  pvVar2 = (*hm_get)(pvVar1,0x7b);
  if (pvVar2 == (void *)0x1c8) {
    pvVar2 = (*hm_get)(pvVar1,0x7c);
    if (pvVar2 == (void *)0x0) {
      (*hm_delete)(pvVar1);
      return;
    }
    pvVar1 = (*hm_get)(pvVar1,0x7c);
    pcVar4 = "hm_get(c, 124)";
    pcVar3 = "0";
    uVar5 = 0;
    uVar6 = 0x82;
  }
  else {
    pvVar1 = (*hm_get)(pvVar1,0x7b);
    pcVar4 = "hm_get(c, 123)";
    pcVar3 = "(void*)456";
    uVar5 = 0x1c8;
    uVar6 = 0x81;
  }
  printf(anon_var_dwarf_29b,pcVar4,pvVar1,pcVar3,uVar5,uVar6);
  bad = 1;
  exit(1);
}

Assistant:

static void test_same_only()
{
    void *c = hm_new();
    hm_insert(c, 123, (void*)456, 0);
    hm_insert(c, 123, (void*)457, 0);
    CHECK(hm_get(c, 123), (void*)456);
    CHECK(hm_get(c, 124), 0);
    hm_delete(c);
}